

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

TRef snap_pref(jit_State *J,GCtrace *T,SnapEntry *map,MSize nmax,BloomFilter seen,IRRef ref)

{
  IRIns *ir_00;
  TRef local_54;
  TRef tr;
  IRIns *ir;
  IRRef ref_local;
  BloomFilter seen_local;
  MSize nmax_local;
  SnapEntry *map_local;
  GCtrace *T_local;
  jit_State *J_local;
  
  ir_00 = T->ir + ref;
  if (ref < 0x8000) {
    local_54 = snap_replay_const(J,ir_00);
  }
  else if (((ir_00->field_0).prev & 0xff80) == 0x80) {
    local_54 = 0;
  }
  else if (((seen & 1L << ((byte)ref & 0x3f)) == 0) ||
          (local_54 = snap_dedup(J,map,nmax,ref), local_54 == 0)) {
    (J->fold).ins.field_0.ot = (ir_00->field_1).t.irt & 0x1f | 0xe00;
    (J->fold).ins.field_0.op1 = (short)ref + 0x8000;
    (J->fold).ins.field_0.op2 = 0;
    local_54 = lj_opt_fold(J);
  }
  return local_54;
}

Assistant:

static TRef snap_pref(jit_State *J, GCtrace *T, SnapEntry *map, MSize nmax,
		      BloomFilter seen, IRRef ref)
{
  IRIns *ir = &T->ir[ref];
  TRef tr;
  if (irref_isk(ref))
    tr = snap_replay_const(J, ir);
  else if (!regsp_used(ir->prev))
    tr = 0;
  else if (!bloomtest(seen, ref) || (tr = snap_dedup(J, map, nmax, ref)) == 0)
    tr = emitir(IRT(IR_PVAL, irt_type(ir->t)), ref - REF_BIAS, 0);
  return tr;
}